

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall TTD::EventLog::ReplayEventLoopYieldPointEvent(EventLog *this)

{
  AutoNestedHandledExceptionType local_14 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_14,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  ThreadContextTTD::ClearLocalRootsAndRefreshMap_Replay(this->m_threadContext->TTDContext);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_14);
  AdvanceTimeAndPositionForReplay(this);
  return;
}

Assistant:

void EventLog::ReplayEventLoopYieldPointEvent()
    {
        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE((ExceptionType)(ExceptionType_OutOfMemory | ExceptionType_StackOverflow));

            this->m_threadContext->TTDContext->ClearLocalRootsAndRefreshMap_Replay();
        }
        catch(...)
        {
            TTDAssert(false, "OOM in yield point replay...");
        }

        this->AdvanceTimeAndPositionForReplay(); //move along
    }